

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugDrawLineExtents(ImU32 col)

{
  float line_y2;
  float line_y1;
  float curr_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_60;
  float local_58;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  float in_stack_ffffffffffffffd8;
  float fVar1;
  ImGuiWindow *p1;
  ImGuiContext *this;
  
  p1 = GImGui->CurrentWindow;
  fVar1 = (p1->DC).CursorPos.x;
  if (((p1->DC).IsSameLine & 1U) == 0) {
    local_58 = (p1->DC).CursorPos.y;
  }
  else {
    local_58 = (p1->DC).CursorPosPrevLine.y;
  }
  if (((p1->DC).IsSameLine & 1U) == 0) {
    local_60 = (p1->DC).CurrLineSize.y;
  }
  else {
    local_60 = (p1->DC).PrevLineSize.y;
  }
  local_60 = local_58 + local_60;
  this = GImGui;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,fVar1 - 5.0,local_58);
  ImVec2::ImVec2(&local_34,fVar1 + 5.0,local_58);
  ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)p1,(ImVec2 *)CONCAT44(fVar1,local_58),
                      (ImU32)local_60,in_stack_ffffffffffffffd8);
  ImVec2::ImVec2(&local_3c,fVar1 - 0.5,local_58);
  ImVec2::ImVec2(&local_44,fVar1 - 0.5,local_60);
  ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)p1,(ImVec2 *)CONCAT44(fVar1,local_58),
                      (ImU32)local_60,in_stack_ffffffffffffffd8);
  ImVec2::ImVec2(&local_4c,fVar1 - 5.0,local_60);
  ImVec2::ImVec2(&local_54,fVar1 + 5.0,local_60);
  ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)p1,(ImVec2 *)CONCAT44(fVar1,local_58),
                      (ImU32)local_60,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ImGui::DebugDrawLineExtents(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float curr_x = window->DC.CursorPos.x;
    float line_y1 = (window->DC.IsSameLine ? window->DC.CursorPosPrevLine.y : window->DC.CursorPos.y);
    float line_y2 = line_y1 + (window->DC.IsSameLine ? window->DC.PrevLineSize.y : window->DC.CurrLineSize.y);
    window->DrawList->AddLine(ImVec2(curr_x - 5.0f, line_y1), ImVec2(curr_x + 5.0f, line_y1), col, 1.0f);
    window->DrawList->AddLine(ImVec2(curr_x - 0.5f, line_y1), ImVec2(curr_x - 0.5f, line_y2), col, 1.0f);
    window->DrawList->AddLine(ImVec2(curr_x - 5.0f, line_y2), ImVec2(curr_x + 5.0f, line_y2), col, 1.0f);
}